

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_has_jump(REF_GEOM ref_geom,REF_INT node,REF_BOOL *has_jump)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  ulong uVar3;
  int iVar4;
  
  *has_jump = 0;
  uVar3 = 0xffffffff;
  if (-1 < node) {
    uVar3 = 0xffffffff;
    if (node < ref_geom->ref_adj->nnode) {
      uVar3 = (ulong)(uint)ref_geom->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar3 != -1) {
    iVar4 = ref_geom->ref_adj->item[(int)uVar3].ref;
    do {
      if (ref_geom->descr[(long)(iVar4 * 6) + 3] != 0) {
        *has_jump = 1;
        return 0;
      }
      pRVar2 = ref_geom->ref_adj->item;
      iVar1 = pRVar2[(int)uVar3].next;
      uVar3 = (ulong)iVar1;
      if (uVar3 == 0xffffffffffffffff) {
        iVar4 = -1;
      }
      else {
        iVar4 = pRVar2[uVar3].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_has_jump(REF_GEOM ref_geom, REF_INT node,
                                     REF_BOOL *has_jump) {
  REF_INT item, geom;
  *has_jump = REF_FALSE;
  each_ref_geom_having_node(ref_geom, node, item, geom) {
    if (0 != ref_geom_jump(ref_geom, geom)) {
      *has_jump = REF_TRUE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}